

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_structure.h
# Opt level: O3

void __thiscall xLearn::DMatrix::~DMatrix(DMatrix *this)

{
  pointer pfVar1;
  pointer ppvVar2;
  
  pfVar1 = (this->norm).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pfVar1 != (pointer)0x0) {
    operator_delete(pfVar1);
  }
  pfVar1 = (this->Y).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pfVar1 != (pointer)0x0) {
    operator_delete(pfVar1);
  }
  ppvVar2 = (this->row).
            super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppvVar2 != (pointer)0x0) {
    operator_delete(ppvVar2);
    return;
  }
  return;
}

Assistant:

~DMatrix() { }